

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

global_object_create_result *
mjs::make_json_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  void *pvVar1;
  long *plVar2;
  function_object *pfVar3;
  gc_heap_ptr_untyped local_c8;
  undefined1 local_b8 [16];
  gc_heap_ptr_untyped local_a8;
  gc_heap_ptr_untyped local_98;
  gc_heap_ptr_untyped local_88;
  gc_heap_ptr_untyped local_78;
  gc_heap_ptr<mjs::object> json;
  value local_58;
  string_view local_30;
  
  pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  if (1 < *(int *)((long)pvVar1 + 0x20)) {
    h = (global->super_gc_heap_ptr_untyped).heap_;
    local_b8._0_8_ = (gc_heap *)0x4;
    local_b8._8_8_ = "JSON";
    string::string((string *)&local_58,h,(string_view *)local_b8);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x58))(&local_c8,plVar2);
    gc_heap::make<mjs::object,mjs::string,mjs::gc_heap_ptr<mjs::object>>
              ((gc_heap *)&json,(string *)h,(gc_heap_ptr<mjs::object> *)&local_58);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_58);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&global->super_gc_heap_ptr_untyped);
    local_30._M_len = 5;
    local_30._M_str = "parse";
    string::string((string *)&local_98,(global->super_gc_heap_ptr_untyped).heap_,&local_30);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&json.super_gc_heap_ptr_untyped);
    make_raw_function((mjs *)&local_a8,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_a8);
    local_c8.heap_ = (gc_heap *)0x0;
    local_c8.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_b8,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b8);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c45d0;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar1 + 0x10),&local_88)
    ;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_b8,
               (gc_heap_ptr<mjs::gc_string> *)&local_98,(gc_heap_ptr<mjs::gc_string> *)&local_c8,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_78,&local_a8);
    value::value(&local_58,(object_ptr *)&local_78);
    (**(code **)(*plVar2 + 8))(plVar2,&local_98,&local_58,2);
    value::~value(&local_58);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&global->super_gc_heap_ptr_untyped);
    local_30._M_len = 9;
    local_30._M_str = "stringify";
    string::string((string *)&local_98,(global->super_gc_heap_ptr_untyped).heap_,&local_30);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&json.super_gc_heap_ptr_untyped);
    make_raw_function((mjs *)&local_a8,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_a8);
    local_c8.heap_ = (gc_heap *)0x0;
    local_c8.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_b8,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b8);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001c4610;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar1 + 0x10),&local_88)
    ;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_b8,
               (gc_heap_ptr<mjs::gc_string> *)&local_98,(gc_heap_ptr<mjs::gc_string> *)&local_c8,3);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_78,&local_a8);
    value::value(&local_58,(object_ptr *)&local_78);
    (**(code **)(*plVar2 + 8))(plVar2,&local_98,&local_58,2);
    value::~value(&local_58);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)__return_storage_ptr__,&json.super_gc_heap_ptr_untyped);
    (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
    (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = 0;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&json.super_gc_heap_ptr_untyped);
    return __return_storage_ptr__;
  }
  __assert_fail("global->language_version() >= version::es5",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                ,0x2e9,
                "global_object_create_result mjs::make_json_object(const gc_heap_ptr<global_object> &)"
               );
}

Assistant:

global_object_create_result make_json_object(const gc_heap_ptr<global_object>& global) {
    assert(global->language_version() >= version::es5);
    auto& h = global.heap();
    auto json = h.make<object>(string{h,"JSON"}, global->object_prototype());

    put_native_function(global, json, "parse", [global](const value&, const std::vector<value>& args) {
        auto g = global; // Keep local copy in case the function gets GC'ed
        return json_parse(g, args);
    }, 2);
    
    put_native_function(global, json, "stringify", [global](const value&, const std::vector<value>& args) {
        auto g = global; // Keep local copy in case the function gets GC'ed
        return json_stringify(g, args);
    }, 3);

    return { json, nullptr };
}